

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O0

int strtoi_lim(char *str,char **ep,int llim,int ulim)

{
  bool bVar1;
  int local_38;
  int local_34;
  char *pcStack_30;
  int rulim;
  char *sp;
  int res;
  int ulim_local;
  int llim_local;
  char **ep_local;
  char *str_local;
  
  sp._4_4_ = 0;
  local_38 = ulim;
  if (ulim < 0xb) {
    local_38 = 10;
  }
  local_34 = local_38;
  pcStack_30 = str;
  while( true ) {
    bVar1 = false;
    if (((sp._4_4_ * 10 <= ulim) && (bVar1 = false, local_34 != 0)) &&
       (bVar1 = false, '/' < *pcStack_30)) {
      bVar1 = *pcStack_30 < ':';
    }
    if (!bVar1) break;
    sp._4_4_ = *pcStack_30 + -0x30 + sp._4_4_ * 10;
    pcStack_30 = pcStack_30 + 1;
    local_34 = local_34 / 10;
  }
  if (pcStack_30 == str) {
    sp._4_4_ = -1;
  }
  else if ((sp._4_4_ < llim) || (ulim < sp._4_4_)) {
    sp._4_4_ = -2;
  }
  *ep = pcStack_30;
  return sp._4_4_;
}

Assistant:

static int
strtoi_lim(const char *str, const char **ep, int llim, int ulim)
{
	int res = 0;
	const char *sp;
	/* we keep track of the number of digits via rulim */
	int rulim;

	for (sp = str, rulim = ulim > 10 ? ulim : 10;
	     res * 10 <= ulim && rulim && *sp >= '0' && *sp <= '9';
	     sp++, rulim /= 10) {
		res *= 10;
		res += *sp - '0';
	}
	if (sp == str) {
		res = -1;
	} else if (res < llim || res > ulim) {
		res = -2;
	}
	*ep = (const char*)sp;
	return res;
}